

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O1

curl_slist * ADSBExchangeConnection::MakeCurlSList(string *theKey)

{
  undefined8 uVar1;
  long *plVar2;
  curl_slist *pcVar3;
  long *plVar4;
  long *local_60;
  long local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  long *local_40 [2];
  long local_30 [2];
  
  uVar1 = curl_slist_append(0,"x-rapidapi-host: adsbexchange-com1.p.rapidapi.com");
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"x-rapidapi-key: ","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_40,(ulong)(theKey->_M_dataplus)._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_50 = *plVar4;
    uStack_48 = (undefined4)plVar2[3];
    uStack_44 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
    local_60 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  pcVar3 = (curl_slist *)curl_slist_append(uVar1,local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return pcVar3;
}

Assistant:

struct curl_slist* ADSBExchangeConnection::MakeCurlSList (const std::string theKey)
{
    struct curl_slist* slist = curl_slist_append(NULL, ADSBEX_RAPIDAPI_HOST);
    return curl_slist_append(slist, (std::string(ADSBEX_RAPIDAPI_KEY)+theKey).c_str());
}